

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

bool __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::current_element_valid
          (list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
           *this)

{
  data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pdVar1;
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.r = (this->super_scrollable_region).super_drawable.m;
  local_28.m = (mutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_28.r,1);
  pdVar1 = (this->items).pos;
  auto_mutex::unlock(&local_28);
  return pdVar1 != (data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                    *)0x0;
}

Assistant:

bool list_box<S>::
    current_element_valid (
    ) const
    {
        auto_mutex M(m);
        return items.current_element_valid();
    }